

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

ctmbstr FindStyle(TidyDocImpl *doc,ctmbstr tag,ctmbstr properties)

{
  Lexer *pLVar1;
  int iVar2;
  TagStyle *pTVar3;
  tmbstr ptVar4;
  char *pcVar5;
  tmbchar buf [512];
  tmbchar atStack_238 [520];
  
  pLVar1 = doc->lexer;
  for (pTVar3 = pLVar1->styles; pTVar3 != (TagStyle *)0x0; pTVar3 = pTVar3->next) {
    iVar2 = prvTidytmbstrcmp(pTVar3->tag,tag);
    if ((iVar2 == 0) && (iVar2 = prvTidytmbstrcmp(pTVar3->properties,properties), iVar2 == 0))
    goto LAB_0014dd9e;
  }
  pTVar3 = (TagStyle *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x20);
  ptVar4 = prvTidytmbstrdup(doc->allocator,tag);
  pTVar3->tag = ptVar4;
  pcVar5 = (doc->config).value[10].p;
  if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
    pcVar5 = anon_var_dwarf_1affc + 0x22;
  }
  doc->nClassId = doc->nClassId + 1;
  prvTidytmbsnprintf(atStack_238,0x200,"%s%u",pcVar5);
  ptVar4 = prvTidytmbstrdup(doc->allocator,atStack_238);
  pTVar3->tag_class = ptVar4;
  ptVar4 = prvTidytmbstrdup(doc->allocator,properties);
  pTVar3->properties = ptVar4;
  pTVar3->next = pLVar1->styles;
  pLVar1->styles = pTVar3;
LAB_0014dd9e:
  return pTVar3->tag_class;
}

Assistant:

static ctmbstr FindStyle( TidyDocImpl* doc, ctmbstr tag, ctmbstr properties )
{
    Lexer* lexer = doc->lexer;
    TagStyle* style;

    for (style = lexer->styles; style; style=style->next)
    {
        if (TY_(tmbstrcmp)(style->tag, tag) == 0 &&
            TY_(tmbstrcmp)(style->properties, properties) == 0)
            return style->tag_class;
    }

    style = (TagStyle *)TidyDocAlloc( doc, sizeof(TagStyle) );
    style->tag = TY_(tmbstrdup)(doc->allocator, tag);
    style->tag_class = GensymClass( doc );
    style->properties = TY_(tmbstrdup)( doc->allocator, properties );
    style->next = lexer->styles;
    lexer->styles = style;
    return style->tag_class;
}